

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O3

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  void *pvVar14;
  size_t sVar15;
  size_t sVar16;
  undefined1 auVar17 [16];
  int *piVar18;
  int iVar19;
  void *pvVar20;
  ulong uVar21;
  long lVar22;
  undefined2 *puVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  void *pvVar27;
  long lVar28;
  uint *puVar29;
  long lVar30;
  undefined4 uVar31;
  undefined2 *puVar32;
  undefined2 *puVar33;
  undefined2 *puVar34;
  long lVar35;
  short tmp [6] [3];
  ulong local_118;
  void *local_e8;
  undefined1 local_a8 [64];
  size_t local_68;
  short asStack_5c [3];
  uint auStack_56 [9];
  
  local_68 = 0;
  local_a8._0_8_ = (void *)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_8_ = 0;
  local_a8._24_4_ = 0;
  local_a8._32_8_ = (Allocator *)0x0;
  local_a8._40_4_ = 0;
  local_a8._44_4_ = 0;
  local_a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  Mat::create((Mat *)local_a8,0x24,inch,outch,2,(Allocator *)0x0);
  if (0 < outch) {
    pvVar14 = kernel->data;
    local_e8 = (void *)local_a8._0_8_;
    local_118 = 0;
    do {
      if (0 < inch) {
        iVar19 = inch * 9 * (int)local_118;
        uVar21 = 0;
        pvVar27 = local_e8;
        do {
          lVar35 = uVar21 * 9;
          cVar1 = *(char *)((long)pvVar14 + lVar35 + iVar19);
          cVar2 = *(char *)((long)pvVar14 + lVar35 + (long)iVar19 + 1);
          cVar3 = *(char *)((long)pvVar14 + lVar35 + (long)iVar19 + 2);
          cVar4 = *(char *)((long)pvVar14 + lVar35 + (long)iVar19 + 3);
          cVar5 = *(char *)((long)pvVar14 + lVar35 + (long)iVar19 + 4);
          cVar6 = *(char *)((long)pvVar14 + lVar35 + (long)iVar19 + 5);
          cVar7 = *(char *)((long)pvVar14 + lVar35 + (long)iVar19 + 6);
          cVar8 = *(char *)((long)pvVar14 + lVar35 + (long)iVar19 + 7);
          cVar9 = *(char *)((long)pvVar14 + lVar35 + (long)iVar19 + 8);
          lVar35 = 4;
          do {
            sVar10 = *(short *)(&UNK_005573cc + lVar35);
            sVar11 = *(short *)(&UNK_005573ce + lVar35);
            sVar12 = *(short *)((long)&DAT_005573d0 + lVar35);
            *(short *)((long)asStack_5c + lVar35) = sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1
            ;
            *(short *)((long)asStack_5c + lVar35 + 2) =
                 sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
            *(short *)((long)auStack_56 + lVar35 + -2) =
                 sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
            lVar35 = lVar35 + 6;
          } while (lVar35 != 0x28);
          lVar35 = 0;
          pvVar20 = pvVar27;
          do {
            sVar10 = *(short *)((long)auStack_56 + lVar35 * 6 + -2);
            uVar13 = *(uint *)((long)auStack_56 + lVar35 * 6);
            puVar29 = &DAT_005573d2;
            lVar30 = 0;
            do {
              auVar17 = vpmullw_avx(ZEXT416(*puVar29),ZEXT416(uVar13));
              uVar31 = vpextrw_avx(auVar17,1);
              *(short *)((long)pvVar20 + lVar30 * 2) =
                   (short)uVar31 + auVar17._0_2_ + *(short *)((long)puVar29 + -2) * sVar10;
              lVar30 = lVar30 + 1;
              puVar29 = (uint *)((long)puVar29 + 6);
            } while (lVar30 != 6);
            lVar35 = lVar35 + 1;
            pvVar20 = (void *)((long)pvVar20 + 0xc);
          } while (lVar35 != 6);
          uVar21 = uVar21 + 1;
          pvVar27 = (void *)((long)pvVar27 + (long)(int)local_a8._44_4_ * local_a8._16_8_);
        } while (uVar21 != (uint)inch);
      }
      local_118 = local_118 + 1;
      local_e8 = (void *)((long)local_e8 + local_68 * local_a8._16_8_);
    } while (local_118 != (uint)outch);
  }
  iVar19 = inch + 7;
  if (-1 < inch) {
    iVar19 = inch;
  }
  iVar24 = outch + 3;
  if (-1 < outch) {
    iVar24 = outch;
  }
  Mat::create(kernel_tm,iVar19 >> 3,0x24,iVar24 >> 2,0x40,0x20,(Allocator *)0x0);
  if (3 < outch) {
    iVar19 = kernel_tm->w;
    pvVar14 = kernel_tm->data;
    sVar15 = kernel_tm->elemsize;
    sVar16 = kernel_tm->cstep;
    uVar21 = 0;
    do {
      puVar32 = (undefined2 *)(local_68 * local_a8._16_8_ * uVar21 + local_a8._0_8_);
      lVar35 = 0;
      do {
        if (7 < inch) {
          lVar30 = (long)pvVar14 + (long)iVar19 * sVar15 * lVar35 + (uVar21 >> 2) * sVar16 * sVar15;
          lVar28 = 0;
          puVar33 = puVar32;
          do {
            lVar25 = 0;
            puVar34 = puVar33;
            do {
              lVar22 = lVar30;
              lVar30 = 0;
              puVar23 = puVar34;
              do {
                *(undefined2 *)(lVar22 + lVar30) = *puVar23;
                puVar23 = (undefined2 *)
                          ((long)puVar23 + (long)(int)local_a8._44_4_ * local_a8._16_8_);
                lVar30 = lVar30 + 2;
              } while (lVar30 != 0x10);
              lVar25 = lVar25 + 1;
              puVar34 = (undefined2 *)((long)puVar34 + local_68 * local_a8._16_8_);
              lVar30 = lVar22 + 0x10;
            } while (lVar25 != 4);
            lVar25 = lVar28 + 0xf;
            puVar33 = puVar33 + (long)(int)local_a8._44_4_ * local_a8._16_8_ * 4;
            lVar30 = lVar22 + 0x10;
            lVar28 = lVar28 + 8;
          } while (lVar25 < inch);
        }
        lVar35 = lVar35 + 1;
        puVar32 = puVar32 + 1;
      } while (lVar35 != 0x24);
      uVar26 = uVar21 + 7;
      uVar21 = uVar21 + 4;
    } while (uVar26 < (uint)outch);
  }
  piVar18 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
  if (piVar18 != (int *)0x0) {
    LOCK();
    *piVar18 = *piVar18 + -1;
    UNLOCK();
    if (*piVar18 == 0) {
      if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_a8._0_8_ != (void *)0x0) {
          free((void *)local_a8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_a8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse_xop(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to4_int8_sse(kernel, kernel_tm, inch, outch, opt);
}